

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkRemapLevels(Wlc_Ntk_t *p,Vec_Int_t *vObjs,int nLevels)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  
  p_01 = Vec_IntStart(nLevels + 1);
  p_02 = Vec_IntStart(nLevels + 1);
  Vec_IntWriteEntry(p_02,nLevels,1);
  p_00 = &p->vLevels;
  for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    iVar2 = Vec_IntEntry(p_00,iVar1);
    Vec_IntWriteEntry(p_02,iVar2,1);
    iVar2 = 0;
    while( true ) {
      pWVar4 = Wlc_NtkObj(p,iVar1);
      if ((int)pWVar4->nFanins <= iVar2) break;
      pWVar4 = Wlc_NtkObj(p,iVar1);
      iVar3 = Wlc_ObjFaninId(pWVar4,iVar2);
      if (iVar3 != 0) {
        iVar3 = Vec_IntEntry(p_00,iVar3);
        Vec_IntWriteEntry(p_02,iVar3,1);
      }
      iVar2 = iVar2 + 1;
    }
  }
  iVar5 = p_02->nSize;
  iVar1 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (iVar2 = 0; iVar5 != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(p_02,iVar2);
    if (iVar3 != 0) {
      Vec_IntWriteEntry(p_01,iVar2,iVar1);
      iVar1 = iVar1 + 1;
    }
  }
  for (iVar5 = 0; iVar5 < (p->vLevels).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar5);
    iVar2 = Vec_IntEntry(p_02,iVar1);
    iVar3 = -1;
    if (iVar2 != 0) {
      iVar3 = Vec_IntEntry(p_01,iVar1);
    }
    Vec_IntWriteEntry(p_00,iVar5,iVar3);
  }
  iVar5 = Vec_IntEntry(p_01,nLevels);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  return iVar5;
}

Assistant:

int Wlc_NtkRemapLevels( Wlc_Ntk_t * p, Vec_Int_t * vObjs, int nLevels )
{
    int i, k, iFanin, iObj, Entry, Level = 0, Res = nLevels;
    Vec_Int_t * vMap  = Vec_IntStart( nLevels+1 );
    Vec_Int_t * vUsed = Vec_IntStart( nLevels+1 );
    // mark used levels
    Vec_IntWriteEntry( vUsed, nLevels, 1 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iObj), 1 );
        Wlc_ObjForEachFanin( Wlc_NtkObj(p, iObj), iFanin, k ) if ( iFanin )
            Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iFanin), 1 );
    }
    // create level map
    Vec_IntForEachEntry( vUsed, Entry, i )
        if ( Entry )
            Vec_IntWriteEntry( vMap, i, Level++ );
    //printf( "Total used levels %d -> %d\n", nLevels, Level );
    // remap levels
    Vec_IntForEachEntry( &p->vLevels, Level, i )
    {
        if ( Vec_IntEntry(vUsed, Level) )
            Vec_IntWriteEntry( &p->vLevels, i, Vec_IntEntry(vMap, Level) );
        else
            Vec_IntWriteEntry( &p->vLevels, i, -1 );
    }
    Res = Vec_IntEntry( vMap, nLevels );
    Vec_IntFree( vUsed );
    Vec_IntFree( vMap );
    return Res;
}